

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh_test.cc
# Opt level: O0

void __thiscall ECDHTest_WycheproofP256_Test::TestBody(ECDHTest_WycheproofP256_Test *this)

{
  function<void_(FileTest_*)> local_30;
  ECDHTest_WycheproofP256_Test *local_10;
  ECDHTest_WycheproofP256_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,RunWycheproofTest);
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp256r1_test.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(ECDHTest, WycheproofP256) {
  FileTestGTest("third_party/wycheproof_testvectors/ecdh_secp256r1_test.txt",
                RunWycheproofTest);
}